

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O0

uint64_t color_cell_compression
                   (uint32_t mode,color_cell_compressor_params *pParams,
                   color_cell_compressor_results *pResults,
                   bc7enc_compress_block_params *pComp_params)

{
  vec4F vVar1;
  vec4F xl_00;
  vec4F xl_01;
  vec4F xl_02;
  vec4F xl_03;
  float afVar2 [4];
  uint64_t uVar3;
  long in_RCX;
  ulong *in_RDX;
  uint *in_RSI;
  int in_EDI;
  float fVar4;
  float fVar5;
  float value;
  vec4F vVar6;
  uint64_t avg_err_1;
  uint32_t a_2;
  uint32_t b_5;
  uint32_t g_3;
  uint32_t r_3;
  color_cell_compressor_results avg_results_1;
  uint64_t avg_err;
  uint32_t b_4;
  uint32_t g_2;
  uint32_t r_2;
  color_cell_compressor_results avg_results;
  uint32_t i_10;
  int hy;
  int ly;
  int Q;
  uint32_t uber_err_thresh;
  uint32_t sel_3;
  uint32_t i_9;
  uint32_t sel_2;
  uint32_t i_8;
  vec4F xh_1;
  vec4F xl_1;
  uint32_t sel_1;
  uint32_t i_7;
  uint32_t sel;
  uint32_t i_6;
  uint32_t max_sel;
  uint32_t min_sel;
  int max_selector;
  uint8_t selectors_temp1 [16];
  uint8_t selectors_temp [16];
  vec4F xh;
  vec4F xl;
  float d_2;
  float c_1;
  float b_3;
  float a_1;
  vec4F whiteVec;
  vec4F maxColor;
  vec4F minColor;
  vec4F c1;
  vec4F c0;
  vec4F b1;
  vec4F b0;
  float d_1;
  vec4F q;
  vec4F color_2;
  uint32_t i_5;
  float h;
  float l;
  float len;
  float m;
  float b_2;
  float g_1;
  float r_1;
  uint32_t iter;
  float vfb;
  float vfg;
  float vfr;
  float b_1;
  float g;
  float r;
  color_quad_u8 *pV;
  uint32_t i_4;
  float cov [6];
  vec4F n;
  vec4F d;
  vec4F c;
  vec4F b;
  vec4F a;
  vec4F color_1;
  uint32_t i_3;
  vec4F meanColorScaled;
  vec4F color;
  uint32_t i_2;
  vec4F axis;
  vec4F meanColor;
  uint32_t i_1;
  bc7enc_bool allSame_1;
  uint32_t ca;
  uint32_t cb_1;
  uint32_t cg_1;
  uint32_t cr_1;
  uint32_t i;
  bc7enc_bool allSame;
  uint32_t cb;
  uint32_t cg;
  uint32_t cr;
  vec4F *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  int local_464;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  float in_stack_fffffffffffffbcc;
  uint32_t in_stack_fffffffffffffbd0;
  float in_stack_fffffffffffffbd4;
  color_cell_compressor_results *in_stack_fffffffffffffbd8;
  color_cell_compressor_params *in_stack_fffffffffffffbe0;
  color_cell_compressor_params *pParams_00;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  undefined4 uVar7;
  color_cell_compressor_params *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  undefined4 in_stack_fffffffffffffc00;
  uint32_t in_stack_fffffffffffffc04;
  uint32_t in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  undefined4 in_stack_fffffffffffffc10;
  uint32_t in_stack_fffffffffffffc14;
  vec4F in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc30;
  undefined1 local_3b8 [44];
  float local_38c [4];
  float local_37c [2];
  float afStack_374 [2];
  uint local_36c;
  int local_368;
  int local_364;
  int local_360;
  uint local_35c;
  float local_358 [4];
  float local_348 [2];
  float afStack_340 [2];
  uint local_338;
  uint local_334;
  float local_330 [4];
  float local_320 [2];
  float afStack_318 [2];
  uint local_310;
  uint local_30c;
  float local_308 [4];
  float local_2f8 [2];
  float afStack_2f0 [2];
  vec4F local_2e8;
  vec4F local_2d8;
  uint local_2c4;
  uint local_2c0;
  uint32_t local_2bc;
  uint local_2b8;
  uint32_t local_2b4;
  uint32_t local_2b0;
  int local_2ac;
  undefined1 local_2a8 [16];
  byte local_298 [16];
  float local_288 [4];
  float local_278 [2];
  float afStack_270 [2];
  vec4F local_268;
  vec4F local_258;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  vec4F local_238;
  vec4F local_228;
  vec4F local_218;
  float local_208 [4];
  float local_1f8 [4];
  float local_1e8 [4];
  float local_1d8 [4];
  float local_1c8;
  vec4F local_1c4;
  float local_1b4 [4];
  uint local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  uint local_184;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  byte *local_168;
  uint local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  vec4F local_138;
  vec4F local_128;
  vec4F local_118;
  vec4F local_108;
  vec4F local_f8;
  float local_e8 [4];
  float local_d8 [4];
  uint local_bc;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  float local_88 [4];
  uint local_78;
  vec4F local_74;
  undefined1 local_64 [8];
  color_quad_u8 *local_5c;
  uint local_54;
  char local_4d;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  char local_35;
  uint local_34;
  uint local_30;
  uint local_2c;
  long local_28;
  ulong *local_20;
  uint *local_18;
  int local_c;
  
  *in_RDX = 0xffffffffffffffff;
  if (in_EDI == 1) {
    local_2c = (uint)**(byte **)(in_RSI + 2);
    local_30 = (uint)*(byte *)(*(long *)(in_RSI + 2) + 1);
    local_34 = (uint)*(byte *)(*(long *)(in_RSI + 2) + 2);
    local_35 = '\x01';
    for (local_3c = 1; local_3c < *in_RSI; local_3c = local_3c + 1) {
      if (((local_2c != *(byte *)(*(long *)(in_RSI + 2) + (ulong)local_3c * 4)) ||
          (local_30 != *(byte *)(*(long *)(in_RSI + 2) + 1 + (ulong)local_3c * 4))) ||
         (local_34 != *(byte *)(*(long *)(in_RSI + 2) + 2 + (ulong)local_3c * 4))) {
        local_35 = '\0';
        break;
      }
    }
    if (local_35 != '\0') {
      uVar3 = pack_mode1_to_one_color
                        (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
                         (uint32_t)in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0,
                         (uint32_t)in_stack_fffffffffffffbcc,
                         (uint8_t *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
      return uVar3;
    }
  }
  else if (in_EDI == 7) {
    local_40 = (uint)**(byte **)(in_RSI + 2);
    local_44 = (uint)*(byte *)(*(long *)(in_RSI + 2) + 1);
    local_48 = (uint)*(byte *)(*(long *)(in_RSI + 2) + 2);
    local_4c = (uint)*(byte *)(*(long *)(in_RSI + 2) + 3);
    local_4d = '\x01';
    for (local_54 = 1; local_54 < *in_RSI; local_54 = local_54 + 1) {
      if ((((local_40 != *(byte *)(*(long *)(in_RSI + 2) + (ulong)local_54 * 4)) ||
           (local_44 != *(byte *)(*(long *)(in_RSI + 2) + 1 + (ulong)local_54 * 4))) ||
          (local_48 != *(byte *)(*(long *)(in_RSI + 2) + 2 + (ulong)local_54 * 4))) ||
         (local_4c != *(byte *)(*(long *)(in_RSI + 2) + 3 + (ulong)local_54 * 4))) {
        local_4d = '\0';
        break;
      }
    }
    if (local_4d != '\0') {
      uVar3 = pack_mode7_to_one_color
                        (in_stack_fffffffffffffbf0,
                         (color_cell_compressor_results *)
                         CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                         (uint32_t)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
                         (uint32_t)in_stack_fffffffffffffbe0,
                         (uint32_t)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                         (uint32_t)in_stack_fffffffffffffbd8,
                         (uint8_t *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                         in_stack_fffffffffffffc08,
                         (color_quad_u8 *)
                         CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      return uVar3;
    }
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_c = in_EDI;
  vec4F_set_scalar((vec4F *)local_64,0.0);
  for (local_78 = 0; local_78 < *local_18; local_78 = local_78 + 1) {
    local_88 = (float  [4])vec4F_from_color((color_quad_u8 *)0x10d91b);
    local_98 = (undefined1  [16])
               vec4F_add((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                         in_stack_fffffffffffffb78);
    local_64 = (undefined1  [8])local_98._0_8_;
    local_5c = (color_quad_u8 *)local_98._8_8_;
  }
  uVar7 = 0x3f800000;
  pParams_00 = (color_cell_compressor_params *)local_64;
  vVar6 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                    (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
  local_a0 = vVar6.m_c._8_8_;
  local_a8 = vVar6.m_c._0_8_;
  local_b8 = (undefined1  [16])
             vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
  local_64 = (undefined1  [8])local_b8._0_8_;
  local_5c = (color_quad_u8 *)local_b8._8_8_;
  vec4F_saturate_in_place((vec4F *)0x10da40);
  if ((char)local_18[0xf] == '\0') {
    memset(&local_158,0,0x18);
    for (local_15c = 0; local_15c < *local_18; local_15c = local_15c + 1) {
      local_168 = (byte *)(*(long *)(local_18 + 2) + (ulong)local_15c * 4);
      local_16c = (float)*local_168 - (float)local_a8;
      local_170 = (float)local_168[1] - local_a8._4_4_;
      local_174 = (float)local_168[2] - (float)local_a0;
      local_158 = local_16c * local_16c + local_158;
      local_154 = local_16c * local_170 + local_154;
      local_150 = local_16c * local_174 + local_150;
      local_14c = local_170 * local_170 + local_14c;
      local_148 = local_170 * local_174 + local_148;
      local_144 = local_174 * local_174 + local_144;
    }
    local_178 = 0.9;
    local_17c = 1.0;
    local_180 = 0.7;
    for (local_184 = 0; local_184 < 3; local_184 = local_184 + 1) {
      local_188 = local_180 * local_150 + local_178 * local_158 + local_17c * local_154;
      local_18c = local_180 * local_148 + local_178 * local_154 + local_17c * local_14c;
      local_190 = local_180 * local_144 + local_178 * local_150 + local_17c * local_148;
      fVar4 = maximumf(ABS(local_188),ABS(local_18c));
      local_194 = maximumf(fVar4,ABS(local_190));
      if (1e-10 < local_194) {
        local_194 = 1.0 / local_194;
        local_188 = local_194 * local_188;
        local_18c = local_194 * local_18c;
        local_190 = local_194 * local_190;
      }
      local_178 = local_188;
      local_17c = local_18c;
      local_180 = local_190;
    }
    local_198 = local_180 * local_180 + local_178 * local_178 + local_17c * local_17c;
    if (1e-10 <= local_198) {
      local_198 = sqrtf(local_198);
      local_198 = 1.0 / local_198;
      local_178 = local_198 * local_178;
      local_17c = local_198 * local_17c;
      local_180 = local_198 * local_180;
      vec4F_set(&local_74,local_178,local_17c,local_180,0.0);
    }
    else {
      vec4F_set_scalar(&local_74,0.0);
    }
  }
  else {
    vec4F_set_scalar(&local_74,0.0);
    for (local_bc = 0; local_bc < *local_18; local_bc = local_bc + 1) {
      local_d8 = (float  [4])vec4F_from_color((color_quad_u8 *)0x10daa0);
      in_stack_fffffffffffffbd8 = (color_cell_compressor_results *)local_d8;
      local_e8 = (float  [4])
                 vec4F_sub((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                           in_stack_fffffffffffffb78);
      local_d8 = local_e8;
      local_f8 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                           (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
      local_108 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
      local_118 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
      local_128 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                            (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
      afVar2 = local_d8;
      if (local_bc == 0) {
        local_138.m_c[0] = local_d8[0];
        local_138.m_c[1] = local_d8[1];
        local_d8._8_8_ = afVar2._8_8_;
        local_138.m_c[2] = local_d8[2];
        local_138.m_c[3] = local_d8[3];
      }
      else {
        local_138.m_c._0_8_ = CONCAT44(local_74.m_c[1],local_74.m_c[0]);
        local_138.m_c[3] = local_74.m_c[3];
        local_138.m_c[2] = local_74.m_c[2];
      }
      local_d8 = afVar2;
      vec4F_normalize_in_place
                ((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      fVar4 = vec4F_dot(&local_f8,&local_138);
      local_74.m_c[0] = fVar4 + local_74.m_c[0];
      fVar4 = vec4F_dot(&local_108,&local_138);
      local_74.m_c[1] = fVar4 + local_74.m_c[1];
      fVar4 = vec4F_dot(&local_118,&local_138);
      local_74.m_c[2] = fVar4 + local_74.m_c[2];
      fVar4 = vec4F_dot(&local_128,&local_138);
      local_74.m_c[3] = fVar4 + local_74.m_c[3];
    }
    vec4F_normalize_in_place((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80))
    ;
  }
  fVar4 = vec4F_dot(&local_74,&local_74);
  if (fVar4 < 0.5) {
    if (*(char *)((long)local_18 + 0x3f) == '\0') {
      in_stack_fffffffffffffbcc = 1.0;
      if ((char)local_18[0xf] == '\0') {
        in_stack_fffffffffffffbcc = 0.0;
      }
      vec4F_set(&local_74,1.0,1.0,1.0,in_stack_fffffffffffffbcc);
    }
    else {
      in_stack_fffffffffffffbd0 = 0;
      in_stack_fffffffffffffbd4 = 0.715;
      if ((char)local_18[0xf] == '\0') {
        in_stack_fffffffffffffbd4 = 0.0;
      }
      vec4F_set(&local_74,0.213,0.715,0.072,in_stack_fffffffffffffbd4);
    }
    vec4F_normalize_in_place((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80))
    ;
  }
  local_19c = 1e+09;
  local_1a0 = -1e+09;
  for (local_1a4 = 0; local_1a4 < *local_18; local_1a4 = local_1a4 + 1) {
    local_1b4 = (float  [4])vec4F_from_color((color_quad_u8 *)0x10e33e);
    local_1c4 = vec4F_sub((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                          in_stack_fffffffffffffb78);
    local_1c8 = vec4F_dot(&local_1c4,&local_74);
    local_19c = minimumf(local_19c,local_1c8);
    local_1a0 = maximumf(local_1a0,local_1c8);
  }
  local_19c = local_19c * 0.003921569;
  local_1a0 = local_1a0 * 0.003921569;
  local_1d8 = (float  [4])
              vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                        (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
  local_1e8 = (float  [4])
              vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                        (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
  local_1f8 = (float  [4])
              vec4F_add((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                        in_stack_fffffffffffffb78);
  local_208 = (float  [4])
              vec4F_add((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                        in_stack_fffffffffffffb78);
  local_218 = vec4F_saturate((vec4F *)0x10e4ce);
  local_228 = vec4F_saturate((vec4F *)0x10e4ed);
  vec4F_set_scalar(&local_238,1.0);
  fVar4 = vec4F_dot(&local_218,&local_238);
  fVar5 = vec4F_dot(&local_228,&local_238);
  vVar6.m_c = local_218.m_c;
  if (fVar5 < fVar4) {
    local_23c = local_218.m_c[0];
    local_240 = local_218.m_c[1];
    local_244 = local_218.m_c[2];
    local_248 = local_218.m_c[3];
    local_218.m_c[0] = local_228.m_c[0];
    local_218.m_c[1] = local_228.m_c[1];
    local_218.m_c[2] = local_228.m_c[2];
    local_218.m_c[3] = local_228.m_c[3];
    vVar1.m_c = local_218.m_c;
    local_218.m_c[0] = vVar6.m_c[0];
    local_218.m_c[1] = vVar6.m_c[1];
    local_218.m_c[2] = vVar6.m_c[2];
    local_218.m_c[3] = vVar6.m_c[3];
    local_228.m_c[0] = local_218.m_c[0];
    local_228.m_c[1] = local_218.m_c[1];
    local_228.m_c[2] = local_218.m_c[2];
    local_228.m_c[3] = local_218.m_c[3];
    local_218.m_c = vVar1.m_c;
  }
  vVar6.m_c[2] = (float)(int)in_stack_fffffffffffffc30;
  vVar6.m_c[3] = (float)(int)((ulong)in_stack_fffffffffffffc30 >> 0x20);
  vVar6.m_c[0] = (float)(int)in_stack_fffffffffffffc28;
  vVar6.m_c[1] = (float)(int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  uVar3 = find_optimal_solution
                    (in_stack_fffffffffffffc14,vVar6,in_stack_fffffffffffffc18,
                     (color_cell_compressor_params *)
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                     (color_cell_compressor_results *)
                     CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  if (uVar3 == 0) {
    return 0;
  }
  if (*(char *)(local_28 + 0x19) != '\0') {
    vec4F_set_scalar(&local_258,0.0);
    vec4F_set_scalar(&local_268,0.0);
    if ((char)local_18[0xf] == '\0') {
      compute_least_squares_endpoints_rgb
                (in_stack_fffffffffffffc04,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (vec4F *)in_stack_fffffffffffffbf0,
                 (vec4F *)CONCAT44(uVar7,in_stack_fffffffffffffbe8),(vec4F *)pParams_00,
                 (color_quad_u8 *)in_stack_fffffffffffffbd8);
    }
    else {
      compute_least_squares_endpoints_rgba
                (in_stack_fffffffffffffc14,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (vec4F *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (vec4F *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (vec4F *)in_stack_fffffffffffffbf0,
                 (color_quad_u8 *)CONCAT44(uVar7,in_stack_fffffffffffffbe8));
    }
    vVar6 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
    afStack_270 = vVar6.m_c._8_8_;
    local_278 = vVar6.m_c._0_8_;
    local_258.m_c._0_8_ = local_278;
    local_258.m_c._8_8_ = afStack_270;
    vVar6 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
    local_288._0_8_ = vVar6.m_c._0_8_;
    local_288._8_8_ = vVar6.m_c._8_8_;
    local_268.m_c[0] = local_288[0];
    local_268.m_c[1] = local_288[1];
    local_268.m_c[2] = local_288[2];
    local_268.m_c[3] = local_288[3];
    vVar1.m_c[2] = (float)(int)in_stack_fffffffffffffc30;
    vVar1.m_c[3] = (float)(int)((ulong)in_stack_fffffffffffffc30 >> 0x20);
    vVar1.m_c[0] = (float)(int)in_stack_fffffffffffffc28;
    vVar1.m_c[1] = (float)(int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
    local_288 = vVar6.m_c;
    uVar3 = find_optimal_solution
                      (in_stack_fffffffffffffc14,vVar1,in_stack_fffffffffffffc18,
                       (color_cell_compressor_params *)
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                       (color_cell_compressor_results *)
                       CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    if (uVar3 == 0) {
      return 0;
    }
  }
  if (*(int *)(local_28 + 0x14) != 0) {
    memcpy(local_298,(void *)local_20[3],(ulong)*local_18);
    local_2ac = local_18[4] - 1;
    local_2b0 = 0x10;
    local_2b4 = 0;
    for (local_2b8 = 0; local_2b8 < *local_18; local_2b8 = local_2b8 + 1) {
      local_2bc = (uint32_t)local_298[local_2b8];
      local_2b0 = minimumu(local_2b0,local_2bc);
      local_2b4 = maximumu(local_2b4,local_2bc);
    }
    for (local_2c0 = 0; local_2c0 < *local_18; local_2c0 = local_2c0 + 1) {
      local_2c4 = (uint)local_298[local_2c0];
      if ((local_2c4 == local_2b0) && (local_2c4 < local_18[4] - 1)) {
        local_2c4 = local_2c4 + 1;
      }
      local_2a8[local_2c0] = (char)local_2c4;
    }
    vec4F_set_scalar(&local_2d8,0.0);
    vec4F_set_scalar(&local_2e8,0.0);
    if ((char)local_18[0xf] == '\0') {
      compute_least_squares_endpoints_rgb
                (in_stack_fffffffffffffc04,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (vec4F *)in_stack_fffffffffffffbf0,
                 (vec4F *)CONCAT44(uVar7,in_stack_fffffffffffffbe8),(vec4F *)pParams_00,
                 (color_quad_u8 *)in_stack_fffffffffffffbd8);
    }
    else {
      compute_least_squares_endpoints_rgba
                (in_stack_fffffffffffffc14,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (vec4F *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (vec4F *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (vec4F *)in_stack_fffffffffffffbf0,
                 (color_quad_u8 *)CONCAT44(uVar7,in_stack_fffffffffffffbe8));
    }
    vVar6 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
    afStack_2f0 = vVar6.m_c._8_8_;
    local_2f8 = vVar6.m_c._0_8_;
    local_2d8.m_c._0_8_ = local_2f8;
    local_2d8.m_c._8_8_ = afStack_2f0;
    vVar6 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
    local_308._0_8_ = vVar6.m_c._0_8_;
    local_308._8_8_ = vVar6.m_c._8_8_;
    local_2e8.m_c[0] = local_308[0];
    local_2e8.m_c[1] = local_308[1];
    local_2e8.m_c[2] = local_308[2];
    local_2e8.m_c[3] = local_308[3];
    xl_00.m_c[2] = (float)(int)in_stack_fffffffffffffc30;
    xl_00.m_c[3] = (float)(int)((ulong)in_stack_fffffffffffffc30 >> 0x20);
    xl_00.m_c[0] = (float)(int)in_stack_fffffffffffffc28;
    xl_00.m_c[1] = (float)(int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
    local_308 = vVar6.m_c;
    uVar3 = find_optimal_solution
                      (in_stack_fffffffffffffc14,xl_00,in_stack_fffffffffffffc18,
                       (color_cell_compressor_params *)
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                       (color_cell_compressor_results *)
                       CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    if (uVar3 == 0) {
      return 0;
    }
    for (local_30c = 0; local_30c < *local_18; local_30c = local_30c + 1) {
      local_310 = (uint)local_298[local_30c];
      if ((local_310 == local_2b4) && (local_310 != 0)) {
        local_310 = local_310 - 1;
      }
      local_2a8[local_30c] = (char)local_310;
    }
    if ((char)local_18[0xf] == '\0') {
      compute_least_squares_endpoints_rgb
                (in_stack_fffffffffffffc04,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (vec4F *)in_stack_fffffffffffffbf0,
                 (vec4F *)CONCAT44(uVar7,in_stack_fffffffffffffbe8),(vec4F *)pParams_00,
                 (color_quad_u8 *)in_stack_fffffffffffffbd8);
    }
    else {
      compute_least_squares_endpoints_rgba
                (in_stack_fffffffffffffc14,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (vec4F *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (vec4F *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (vec4F *)in_stack_fffffffffffffbf0,
                 (color_quad_u8 *)CONCAT44(uVar7,in_stack_fffffffffffffbe8));
    }
    vVar6 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
    afStack_318 = vVar6.m_c._8_8_;
    local_320 = vVar6.m_c._0_8_;
    local_2d8.m_c._0_8_ = local_320;
    local_2d8.m_c._8_8_ = afStack_318;
    vVar6 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
    local_330._0_8_ = vVar6.m_c._0_8_;
    local_330._8_8_ = vVar6.m_c._8_8_;
    local_2e8.m_c[0] = local_330[0];
    local_2e8.m_c[1] = local_330[1];
    local_2e8.m_c[2] = local_330[2];
    local_2e8.m_c[3] = local_330[3];
    xl_01.m_c[2] = (float)(int)in_stack_fffffffffffffc30;
    xl_01.m_c[3] = (float)(int)((ulong)in_stack_fffffffffffffc30 >> 0x20);
    xl_01.m_c[0] = (float)(int)in_stack_fffffffffffffc28;
    xl_01.m_c[1] = (float)(int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
    local_330 = vVar6.m_c;
    uVar3 = find_optimal_solution
                      (in_stack_fffffffffffffc14,xl_01,in_stack_fffffffffffffc18,
                       (color_cell_compressor_params *)
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                       (color_cell_compressor_results *)
                       CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    if (uVar3 == 0) {
      return 0;
    }
    for (local_334 = 0; local_334 < *local_18; local_334 = local_334 + 1) {
      local_338 = (uint)local_298[local_334];
      if ((local_338 == local_2b0) && (local_338 < local_18[4] - 1)) {
        local_338 = local_338 + 1;
      }
      else if ((local_338 == local_2b4) && (local_338 != 0)) {
        local_338 = local_338 - 1;
      }
      local_2a8[local_334] = (char)local_338;
    }
    if ((char)local_18[0xf] == '\0') {
      compute_least_squares_endpoints_rgb
                (in_stack_fffffffffffffc04,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (vec4F *)in_stack_fffffffffffffbf0,
                 (vec4F *)CONCAT44(uVar7,in_stack_fffffffffffffbe8),(vec4F *)pParams_00,
                 (color_quad_u8 *)in_stack_fffffffffffffbd8);
    }
    else {
      compute_least_squares_endpoints_rgba
                (in_stack_fffffffffffffc14,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                 (vec4F *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                 (vec4F *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                 (vec4F *)in_stack_fffffffffffffbf0,
                 (color_quad_u8 *)CONCAT44(uVar7,in_stack_fffffffffffffbe8));
    }
    vVar6 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
    afStack_340 = vVar6.m_c._8_8_;
    local_348 = vVar6.m_c._0_8_;
    local_2d8.m_c._0_8_ = local_348;
    local_2d8.m_c._8_8_ = afStack_340;
    vVar6 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                      (float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
    local_358._0_8_ = vVar6.m_c._0_8_;
    local_358._8_8_ = vVar6.m_c._8_8_;
    local_2e8.m_c[0] = local_358[0];
    local_2e8.m_c[1] = local_358[1];
    local_2e8.m_c[2] = local_358[2];
    local_2e8.m_c[3] = local_358[3];
    xl_02.m_c[2] = (float)(int)in_stack_fffffffffffffc30;
    xl_02.m_c[3] = (float)(int)((ulong)in_stack_fffffffffffffc30 >> 0x20);
    xl_02.m_c[0] = (float)(int)in_stack_fffffffffffffc28;
    xl_02.m_c[1] = (float)(int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
    local_358 = vVar6.m_c;
    uVar3 = find_optimal_solution
                      (in_stack_fffffffffffffc14,xl_02,in_stack_fffffffffffffc18,
                       (color_cell_compressor_params *)
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                       (color_cell_compressor_results *)
                       CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    if (uVar3 == 0) {
      return 0;
    }
    local_35c = *local_18 * 0x38 >> 4;
    if ((1 < *(uint *)(local_28 + 0x14)) && ((ulong)local_35c < *local_20)) {
      if (*(uint *)(local_28 + 0x14) < 4) {
        local_464 = 1;
      }
      else {
        local_464 = *(int *)(local_28 + 0x14) + -2;
      }
      local_360 = local_464;
      for (local_364 = -local_464; local_364 < 2; local_364 = local_364 + 1) {
        for (local_368 = local_2ac + -1; local_368 <= local_2ac + local_360;
            local_368 = local_368 + 1) {
          if ((local_364 != 0) || (local_368 != local_2ac)) {
            for (local_36c = 0; local_36c < *local_18; local_36c = local_36c + 1) {
              fVar5 = (float)local_2ac;
              value = floorf((fVar5 * ((float)local_298[local_36c] - (float)local_364)) /
                             ((float)local_368 - (float)local_364) + 0.5);
              fVar5 = clampf(value,0.0,fVar5);
              local_2a8[local_36c] = (char)(int)fVar5;
            }
            vec4F_set_scalar(&local_2d8,0.0);
            vec4F_set_scalar(&local_2e8,0.0);
            if ((char)local_18[0xf] == '\0') {
              compute_least_squares_endpoints_rgb
                        (in_stack_fffffffffffffc04,
                         (uint8_t *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                         (vec4F *)in_stack_fffffffffffffbf0,
                         (vec4F *)CONCAT44(uVar7,in_stack_fffffffffffffbe8),(vec4F *)pParams_00,
                         (color_quad_u8 *)in_stack_fffffffffffffbd8);
            }
            else {
              compute_least_squares_endpoints_rgba
                        (in_stack_fffffffffffffc14,
                         (uint8_t *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                         (vec4F *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                         (vec4F *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                         (vec4F *)in_stack_fffffffffffffbf0,
                         (color_quad_u8 *)CONCAT44(uVar7,in_stack_fffffffffffffbe8));
            }
            vVar6 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80)
                              ,(float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
            afStack_374 = vVar6.m_c._8_8_;
            local_37c = vVar6.m_c._0_8_;
            local_2d8.m_c._0_8_ = local_37c;
            local_2d8.m_c._8_8_ = afStack_374;
            vVar6 = vec4F_mul((vec4F *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80)
                              ,(float)((ulong)in_stack_fffffffffffffb78 >> 0x20));
            local_38c._0_8_ = vVar6.m_c._0_8_;
            local_38c._8_8_ = vVar6.m_c._8_8_;
            local_2e8.m_c[0] = local_38c[0];
            local_2e8.m_c[1] = local_38c[1];
            local_2e8.m_c[2] = local_38c[2];
            local_2e8.m_c[3] = local_38c[3];
            xl_03.m_c[2] = (float)(int)in_stack_fffffffffffffc30;
            xl_03.m_c[3] = (float)(int)((ulong)in_stack_fffffffffffffc30 >> 0x20);
            xl_03.m_c[0] = (float)(int)in_stack_fffffffffffffc28;
            xl_03.m_c[1] = (float)(int)((ulong)in_stack_fffffffffffffc28 >> 0x20);
            local_38c = vVar6.m_c;
            uVar3 = find_optimal_solution
                              (in_stack_fffffffffffffc14,xl_03,in_stack_fffffffffffffc18,
                               (color_cell_compressor_params *)
                               CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                               (color_cell_compressor_results *)
                               CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
            if (uVar3 == 0) {
              return 0;
            }
          }
        }
      }
    }
  }
  if (local_c == 1) {
    memcpy(local_3b8,local_20,0x28);
    uVar3 = pack_mode1_to_one_color
                      (pParams_00,in_stack_fffffffffffffbd8,(uint32_t)in_stack_fffffffffffffbd4,
                       in_stack_fffffffffffffbd0,(uint32_t)in_stack_fffffffffffffbcc,
                       (uint8_t *)CONCAT44(fVar4,in_stack_fffffffffffffbc0));
    if (uVar3 < *local_20) {
      memcpy(local_20,local_3b8,0x28);
      memcpy((void *)local_20[3],(void *)local_20[4],(ulong)*local_18);
      *local_20 = uVar3;
    }
  }
  else if (local_c == 7) {
    memcpy(&stack0xfffffffffffffc08,local_20,0x28);
    uVar3 = pack_mode7_to_one_color
                      (in_stack_fffffffffffffbf0,
                       (color_cell_compressor_results *)CONCAT44(uVar7,in_stack_fffffffffffffbe8),
                       (uint32_t)((ulong)pParams_00 >> 0x20),(uint32_t)pParams_00,
                       (uint32_t)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                       (uint32_t)in_stack_fffffffffffffbd8,
                       (uint8_t *)
                       CONCAT44((int)((float)local_64._0_4_ * 255.0 + 0.5),
                                (int)((float)local_64._4_4_ * 255.0 + 0.5)),
                       in_stack_fffffffffffffc08,
                       (color_quad_u8 *)
                       CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    if (uVar3 < *local_20) {
      memcpy(local_20,&stack0xfffffffffffffc08,0x28);
      memcpy((void *)local_20[3],(void *)local_20[4],(ulong)*local_18);
      *local_20 = uVar3;
    }
  }
  return *local_20;
}

Assistant:

static uint64_t color_cell_compression(uint32_t mode, const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, const bc7enc_compress_block_params *pComp_params)
{
	assert((mode == 6) || (mode == 7) || (!pParams->m_has_alpha));

	pResults->m_best_overall_err = UINT64_MAX;

	// If the partition's colors are all the same in mode 1, then just pack them as a single color.
	if (mode == 1)
	{
		const uint32_t cr = pParams->m_pPixels[0].m_c[0], cg = pParams->m_pPixels[0].m_c[1], cb = pParams->m_pPixels[0].m_c[2];

		bc7enc_bool allSame = BC7ENC_TRUE;
		for (uint32_t i = 1; i < pParams->m_num_pixels; i++)
		{
			if ((cr != pParams->m_pPixels[i].m_c[0]) || (cg != pParams->m_pPixels[i].m_c[1]) || (cb != pParams->m_pPixels[i].m_c[2]))
			{
				allSame = BC7ENC_FALSE;
				break;
			}
		}

		if (allSame)
			return pack_mode1_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
	}
	else if (mode == 7)
	{
		const uint32_t cr = pParams->m_pPixels[0].m_c[0], cg = pParams->m_pPixels[0].m_c[1], cb = pParams->m_pPixels[0].m_c[2], ca = pParams->m_pPixels[0].m_c[3];

		bc7enc_bool allSame = BC7ENC_TRUE;
		for (uint32_t i = 1; i < pParams->m_num_pixels; i++)
		{
			if ((cr != pParams->m_pPixels[i].m_c[0]) || (cg != pParams->m_pPixels[i].m_c[1]) || (cb != pParams->m_pPixels[i].m_c[2]) || (ca != pParams->m_pPixels[i].m_c[3]))
			{
				allSame = BC7ENC_FALSE;
				break;
			}
		}

		if (allSame)
			return pack_mode7_to_one_color(pParams, pResults, cr, cg, cb, ca, pResults->m_pSelectors, pParams->m_num_pixels, pParams->m_pPixels);
	}

	// Compute partition's mean color and principle axis.
	vec4F meanColor, axis;
	vec4F_set_scalar(&meanColor, 0.0f);

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
		meanColor = vec4F_add(&meanColor, &color);
	}
				
	vec4F meanColorScaled = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels));

	meanColor = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels * 255.0f));
	vec4F_saturate_in_place(&meanColor);

	if (pParams->m_has_alpha)
	{
		// Use incremental PCA for RGBA PCA, because it's simple.
		vec4F_set_scalar(&axis, 0.0f);
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
			color = vec4F_sub(&color, &meanColorScaled);
			vec4F a = vec4F_mul(&color, color.m_c[0]);
			vec4F b = vec4F_mul(&color, color.m_c[1]);
			vec4F c = vec4F_mul(&color, color.m_c[2]);
			vec4F d = vec4F_mul(&color, color.m_c[3]);
			vec4F n = i ? axis : color;
			vec4F_normalize_in_place(&n);
			axis.m_c[0] += vec4F_dot(&a, &n);
			axis.m_c[1] += vec4F_dot(&b, &n);
			axis.m_c[2] += vec4F_dot(&c, &n);
			axis.m_c[3] += vec4F_dot(&d, &n);
		}
		vec4F_normalize_in_place(&axis);
	}
	else
	{
		// Use covar technique for RGB PCA, because it doesn't require per-pixel normalization.
		float cov[6] = { 0, 0, 0, 0, 0, 0 };

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			const color_quad_u8 *pV = &pParams->m_pPixels[i];
			float r = pV->m_c[0] - meanColorScaled.m_c[0];
			float g = pV->m_c[1] - meanColorScaled.m_c[1];
			float b = pV->m_c[2] - meanColorScaled.m_c[2];
			cov[0] += r*r; cov[1] += r*g; cov[2] += r*b; cov[3] += g*g; cov[4] += g*b; cov[5] += b*b;
		}

		float vfr = .9f, vfg = 1.0f, vfb = .7f;
		for (uint32_t iter = 0; iter < 3; iter++)
		{
			float r = vfr*cov[0] + vfg*cov[1] + vfb*cov[2];
			float g = vfr*cov[1] + vfg*cov[3] + vfb*cov[4];
			float b = vfr*cov[2] + vfg*cov[4] + vfb*cov[5];

			float m = maximumf(maximumf(fabsf(r), fabsf(g)), fabsf(b));
			if (m > 1e-10f)
			{
				m = 1.0f / m;
				r *= m; g *= m;	b *= m;
			}

			vfr = r; vfg = g; vfb = b;
		}

		float len = vfr*vfr + vfg*vfg + vfb*vfb;
		if (len < 1e-10f)
			vec4F_set_scalar(&axis, 0.0f);
		else
		{
			len = 1.0f / sqrtf(len);
			vfr *= len; vfg *= len; vfb *= len;
			vec4F_set(&axis, vfr, vfg, vfb, 0);
		}
	}

	// TODO: Try picking the 2 colors with the largest projection onto the axis, instead of computing new colors along the axis.
				
	if (vec4F_dot(&axis, &axis) < .5f)
	{
		if (pParams->m_perceptual)
			vec4F_set(&axis, .213f, .715f, .072f, pParams->m_has_alpha ? .715f : 0);
		else
			vec4F_set(&axis, 1.0f, 1.0f, 1.0f, pParams->m_has_alpha ? 1.0f : 0);
		vec4F_normalize_in_place(&axis);
	}

	float l = 1e+9f, h = -1e+9f;

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);

		vec4F q = vec4F_sub(&color, &meanColorScaled);
		float d = vec4F_dot(&q, &axis);

		l = minimumf(l, d);
		h = maximumf(h, d);
	}

	l *= (1.0f / 255.0f);
	h *= (1.0f / 255.0f);

	vec4F b0 = vec4F_mul(&axis, l);
	vec4F b1 = vec4F_mul(&axis, h);
	vec4F c0 = vec4F_add(&meanColor, &b0);
	vec4F c1 = vec4F_add(&meanColor, &b1);
	vec4F minColor = vec4F_saturate(&c0);
	vec4F maxColor = vec4F_saturate(&c1);
				
	vec4F whiteVec;
	vec4F_set_scalar(&whiteVec, 1.0f);

	if (vec4F_dot(&minColor, &whiteVec) > vec4F_dot(&maxColor, &whiteVec))
	{
#if 0
		// Don't compile correctly with VC 2019 in release.
		vec4F temp = minColor;
		minColor = maxColor;
		maxColor = temp;
#else
		float a = minColor.m_c[0], b = minColor.m_c[1], c = minColor.m_c[2], d = minColor.m_c[3];
		minColor.m_c[0] = maxColor.m_c[0];
		minColor.m_c[1] = maxColor.m_c[1];
		minColor.m_c[2] = maxColor.m_c[2];
		minColor.m_c[3] = maxColor.m_c[3];
		maxColor.m_c[0] = a;
		maxColor.m_c[1] = b;
		maxColor.m_c[2] = c;
		maxColor.m_c[3] = d;
#endif
	}

	// First find a solution using the block's PCA.
	if (!find_optimal_solution(mode, minColor, maxColor, pParams, pResults))
		return 0;
	
	if (pComp_params->m_try_least_squares)
	{
		// Now try to refine the solution using least squares by computing the optimal endpoints from the current selectors.
		vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;
	}
	
	if (pComp_params->m_uber_level > 0)
	{
		// In uber level 1, try varying the selectors a little, somewhat like cluster fit would. First try incrementing the minimum selectors,
		// then try decrementing the selectrors, then try both.
		uint8_t selectors_temp[16], selectors_temp1[16];
		memcpy(selectors_temp, pResults->m_pSelectors, pParams->m_num_pixels);

		const int max_selector = pParams->m_num_selector_weights - 1;

		uint32_t min_sel = 16;
		uint32_t max_sel = 0;
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			min_sel = minimumu(min_sel, sel);
			max_sel = maximumu(max_sel, sel);
		}

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			selectors_temp1[i] = (uint8_t)sel;
		}

		vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			else if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		// In uber levels 2+, try taking more advantage of endpoint extrapolation by scaling the selectors in one direction or another.
		const uint32_t uber_err_thresh = (pParams->m_num_pixels * 56) >> 4;
		if ((pComp_params->m_uber_level >= 2) && (pResults->m_best_overall_err > uber_err_thresh))
		{
			const int Q = (pComp_params->m_uber_level >= 4) ? (pComp_params->m_uber_level - 2) : 1;
			for (int ly = -Q; ly <= 1; ly++)
			{
				for (int hy = max_selector - 1; hy <= (max_selector + Q); hy++)
				{
					if ((ly == 0) && (hy == max_selector))
						continue;

					for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
						selectors_temp1[i] = (uint8_t)clampf(floorf((float)max_selector * ((float)selectors_temp[i] - (float)ly) / ((float)hy - (float)ly) + .5f), 0, (float)max_selector);

					//vec4F xl, xh;
					vec4F_set_scalar(&xl, 0.0f);
					vec4F_set_scalar(&xh, 0.0f);
					if (pParams->m_has_alpha)
						compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
					else
						compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

					xl = vec4F_mul(&xl, (1.0f / 255.0f));
					xh = vec4F_mul(&xh, (1.0f / 255.0f));

					if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
						return 0;
				}
			}
		}
	}

	if (mode == 1)
	{
		// Try encoding the partition as a single color by using the optimal singe colors tables to encode the block to its mean.
		color_cell_compressor_results avg_results = *pResults;
		const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
		uint64_t avg_err = pack_mode1_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
		if (avg_err < pResults->m_best_overall_err)
		{
			*pResults = avg_results;
			memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
			pResults->m_best_overall_err = avg_err;
		}
	}
	else if (mode == 7)
	{
		// Try encoding the partition as a single color by using the optimal singe colors tables to encode the block to its mean.
		color_cell_compressor_results avg_results = *pResults;
		const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f), a = (int)(.5f + meanColor.m_c[3] * 255.0f);
		uint64_t avg_err = pack_mode7_to_one_color(pParams, &avg_results, r, g, b, a, pResults->m_pSelectors_temp, pParams->m_num_pixels, pParams->m_pPixels);
		if (avg_err < pResults->m_best_overall_err)
		{
			*pResults = avg_results;
			memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
			pResults->m_best_overall_err = avg_err;
		}
	}
				
	return pResults->m_best_overall_err;
}